

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramUniformTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::UniformCase::writeUniformDefinitions(UniformCase *this,ostringstream *dst)

{
  int iVar1;
  ostringstream *str;
  bool bVar2;
  bool bVar3;
  int iVar4;
  DataType DVar5;
  UniformCollection *pUVar6;
  StructType *structPtr;
  ostream *poVar7;
  Uniform *pUVar8;
  char *__s;
  size_type sVar9;
  const_reference pvVar10;
  long lVar11;
  DeclareStructTypePtr DVar12;
  int local_f0;
  DataType retType;
  int i_2;
  bool containsTypeSampler;
  dataTypePredicate (*typeReq) [2];
  undefined1 local_d8 [4];
  int compFuncNdx;
  vector<glu::DataType,_std::allocator<glu::DataType>_> samplerTypes;
  allocator<char> local_a9;
  string local_a8;
  DeclareVariable local_88;
  int local_44;
  StructType *pSStack_40;
  int i_1;
  int local_38;
  DeclareStructTypePtr local_30;
  int local_1c;
  ostringstream *poStack_18;
  int i;
  ostringstream *dst_local;
  UniformCase *this_local;
  
  local_1c = 0;
  poStack_18 = dst;
  dst_local = (ostringstream *)this;
  while( true ) {
    iVar1 = local_1c;
    pUVar6 = de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::UniformCollection>
             ::operator->(&this->m_uniformCollection);
    iVar4 = anon_unknown_1::UniformCollection::getNumStructTypes(pUVar6);
    str = poStack_18;
    if (iVar4 <= iVar1) break;
    pUVar6 = de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::UniformCollection>
             ::operator->(&this->m_uniformCollection);
    structPtr = anon_unknown_1::UniformCollection::getStructType(pUVar6,local_1c);
    DVar12 = glu::declare(structPtr,0);
    pSStack_40 = DVar12.structPtr;
    local_38 = DVar12.indentLevel;
    local_30.structPtr = pSStack_40;
    local_30.indentLevel = local_38;
    poVar7 = glu::decl::operator<<
                       (&str->super_basic_ostream<char,_std::char_traits<char>_>,&local_30);
    std::operator<<(poVar7,";\n");
    local_1c = local_1c + 1;
  }
  local_44 = 0;
  while( true ) {
    iVar1 = local_44;
    pUVar6 = de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::UniformCollection>
             ::operator->(&this->m_uniformCollection);
    iVar4 = anon_unknown_1::UniformCollection::getNumUniforms(pUVar6);
    if (iVar4 <= iVar1) break;
    poVar7 = std::operator<<(&poStack_18->super_basic_ostream<char,_std::char_traits<char>_>,
                             "uniform ");
    pUVar6 = de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::UniformCollection>
             ::operator->(&this->m_uniformCollection);
    pUVar8 = anon_unknown_1::UniformCollection::getUniform(pUVar6,local_44);
    pUVar6 = de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::UniformCollection>
             ::operator->(&this->m_uniformCollection);
    anon_unknown_1::UniformCollection::getUniform(pUVar6,local_44);
    __s = (char *)std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,__s,&local_a9);
    glu::declare(&local_88,&pUVar8->type,&local_a8,0);
    poVar7 = glu::decl::operator<<(poVar7,&local_88);
    std::operator<<(poVar7,";\n");
    glu::decl::DeclareVariable::~DeclareVariable(&local_88);
    std::__cxx11::string::~string((string *)&local_a8);
    std::allocator<char>::~allocator(&local_a9);
    local_44 = local_44 + 1;
  }
  std::operator<<(&poStack_18->super_basic_ostream<char,_std::char_traits<char>_>,"\n");
  pUVar6 = de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::UniformCollection>::
           operator->(&this->m_uniformCollection);
  anon_unknown_1::UniformCollection::getSamplerTypes
            ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)local_d8,pUVar6);
  typeReq._4_4_ = 0;
  do {
    if (0x18 < typeReq._4_4_) {
      std::vector<glu::DataType,_std::allocator<glu::DataType>_>::~vector
                ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)local_d8);
      return;
    }
    lVar11 = (long)typeReq._4_4_;
    bVar3 = false;
    for (local_f0 = 0;
        sVar9 = std::vector<glu::DataType,_std::allocator<glu::DataType>_>::size
                          ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)local_d8),
        local_f0 < (int)sVar9; local_f0 = local_f0 + 1) {
      pvVar10 = std::vector<glu::DataType,_std::allocator<glu::DataType>_>::operator[]
                          ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)local_d8,
                           (long)local_f0);
      bVar2 = glu::isDataTypeSampler(*pvVar10);
      if (bVar2) {
        pvVar10 = std::vector<glu::DataType,_std::allocator<glu::DataType>_>::operator[]
                            ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)local_d8,
                             (long)local_f0);
        DVar5 = getSamplerLookupReturnType(*pvVar10);
        bVar2 = (*writeUniformDefinitions::compareFuncs[lVar11].requiringTypes[0])(DVar5);
        if ((bVar2) ||
           (bVar2 = (*writeUniformDefinitions::compareFuncs[lVar11].requiringTypes[1])(DVar5), bVar2
           )) {
          bVar3 = true;
          break;
        }
      }
    }
    if (bVar3) {
LAB_022298d4:
      poVar7 = std::operator<<(&poStack_18->super_basic_ostream<char,_std::char_traits<char>_>,
                               writeUniformDefinitions::compareFuncs[typeReq._4_4_].definition);
      std::operator<<(poVar7,"\n");
    }
    else {
      pUVar6 = de::
               SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::UniformCollection>::
               operator->(&this->m_uniformCollection);
      bVar3 = anon_unknown_1::UniformCollection::containsMatchingBasicType
                        (pUVar6,writeUniformDefinitions::compareFuncs[lVar11].requiringTypes[0]);
      if (bVar3) goto LAB_022298d4;
      pUVar6 = de::
               SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::UniformCollection>::
               operator->(&this->m_uniformCollection);
      bVar3 = anon_unknown_1::UniformCollection::containsMatchingBasicType
                        (pUVar6,writeUniformDefinitions::compareFuncs[lVar11].requiringTypes[1]);
      if (bVar3) goto LAB_022298d4;
    }
    typeReq._4_4_ = typeReq._4_4_ + 1;
  } while( true );
}

Assistant:

void UniformCase::writeUniformDefinitions (std::ostringstream& dst) const
{
	for (int i = 0; i < (int)m_uniformCollection->getNumStructTypes(); i++)
		dst << glu::declare(m_uniformCollection->getStructType(i)) << ";\n";

	for (int i = 0; i < (int)m_uniformCollection->getNumUniforms(); i++)
		dst << "uniform " << glu::declare(m_uniformCollection->getUniform(i).type, m_uniformCollection->getUniform(i).name.c_str()) << ";\n";

	dst << "\n";

	{
		static const struct
		{
			dataTypePredicate	requiringTypes[2];
			const char*			definition;
		} compareFuncs[] =
		{
			{ { glu::isDataTypeFloatOrVec,				glu::isDataTypeMatrix				}, "mediump float compare_float    (mediump float a, mediump float b)  { return abs(a - b) < 0.05 ? 1.0 : 0.0; }"																		},
			{ { dataTypeEquals<glu::TYPE_FLOAT_VEC2>,	dataTypeIsMatrixWithNRows<2>		}, "mediump float compare_vec2     (mediump vec2 a, mediump vec2 b)    { return compare_float(a.x, b.x)*compare_float(a.y, b.y); }"														},
			{ { dataTypeEquals<glu::TYPE_FLOAT_VEC3>,	dataTypeIsMatrixWithNRows<3>		}, "mediump float compare_vec3     (mediump vec3 a, mediump vec3 b)    { return compare_float(a.x, b.x)*compare_float(a.y, b.y)*compare_float(a.z, b.z); }"								},
			{ { dataTypeEquals<glu::TYPE_FLOAT_VEC4>,	dataTypeIsMatrixWithNRows<4>		}, "mediump float compare_vec4     (mediump vec4 a, mediump vec4 b)    { return compare_float(a.x, b.x)*compare_float(a.y, b.y)*compare_float(a.z, b.z)*compare_float(a.w, b.w); }"		},
			{ { dataTypeEquals<glu::TYPE_FLOAT_MAT2>,	dataTypeEquals<glu::TYPE_INVALID>	}, "mediump float compare_mat2     (mediump mat2 a, mediump mat2 b)    { return compare_vec2(a[0], b[0])*compare_vec2(a[1], b[1]); }"													},
			{ { dataTypeEquals<glu::TYPE_FLOAT_MAT2X3>,	dataTypeEquals<glu::TYPE_INVALID>	}, "mediump float compare_mat2x3   (mediump mat2x3 a, mediump mat2x3 b){ return compare_vec3(a[0], b[0])*compare_vec3(a[1], b[1]); }"													},
			{ { dataTypeEquals<glu::TYPE_FLOAT_MAT2X4>,	dataTypeEquals<glu::TYPE_INVALID>	}, "mediump float compare_mat2x4   (mediump mat2x4 a, mediump mat2x4 b){ return compare_vec4(a[0], b[0])*compare_vec4(a[1], b[1]); }"													},
			{ { dataTypeEquals<glu::TYPE_FLOAT_MAT3X2>,	dataTypeEquals<glu::TYPE_INVALID>	}, "mediump float compare_mat3x2   (mediump mat3x2 a, mediump mat3x2 b){ return compare_vec2(a[0], b[0])*compare_vec2(a[1], b[1])*compare_vec2(a[2], b[2]); }"							},
			{ { dataTypeEquals<glu::TYPE_FLOAT_MAT3>,	dataTypeEquals<glu::TYPE_INVALID>	}, "mediump float compare_mat3     (mediump mat3 a, mediump mat3 b)    { return compare_vec3(a[0], b[0])*compare_vec3(a[1], b[1])*compare_vec3(a[2], b[2]); }"							},
			{ { dataTypeEquals<glu::TYPE_FLOAT_MAT3X4>,	dataTypeEquals<glu::TYPE_INVALID>	}, "mediump float compare_mat3x4   (mediump mat3x4 a, mediump mat3x4 b){ return compare_vec4(a[0], b[0])*compare_vec4(a[1], b[1])*compare_vec4(a[2], b[2]); }"							},
			{ { dataTypeEquals<glu::TYPE_FLOAT_MAT4X2>,	dataTypeEquals<glu::TYPE_INVALID>	}, "mediump float compare_mat4x2   (mediump mat4x2 a, mediump mat4x2 b){ return compare_vec2(a[0], b[0])*compare_vec2(a[1], b[1])*compare_vec2(a[2], b[2])*compare_vec2(a[3], b[3]); }"	},
			{ { dataTypeEquals<glu::TYPE_FLOAT_MAT4X3>,	dataTypeEquals<glu::TYPE_INVALID>	}, "mediump float compare_mat4x3   (mediump mat4x3 a, mediump mat4x3 b){ return compare_vec3(a[0], b[0])*compare_vec3(a[1], b[1])*compare_vec3(a[2], b[2])*compare_vec3(a[3], b[3]); }"	},
			{ { dataTypeEquals<glu::TYPE_FLOAT_MAT4>,	dataTypeEquals<glu::TYPE_INVALID>	}, "mediump float compare_mat4     (mediump mat4 a, mediump mat4 b)    { return compare_vec4(a[0], b[0])*compare_vec4(a[1], b[1])*compare_vec4(a[2], b[2])*compare_vec4(a[3], b[3]); }"	},
			{ { dataTypeEquals<glu::TYPE_INT>,			dataTypeEquals<glu::TYPE_INVALID>	}, "mediump float compare_int      (mediump int a, mediump int b)      { return a == b ? 1.0 : 0.0; }"																					},
			{ { dataTypeEquals<glu::TYPE_INT_VEC2>,		dataTypeEquals<glu::TYPE_INVALID>	}, "mediump float compare_ivec2    (mediump ivec2 a, mediump ivec2 b)  { return a == b ? 1.0 : 0.0; }"																					},
			{ { dataTypeEquals<glu::TYPE_INT_VEC3>,		dataTypeEquals<glu::TYPE_INVALID>	}, "mediump float compare_ivec3    (mediump ivec3 a, mediump ivec3 b)  { return a == b ? 1.0 : 0.0; }"																					},
			{ { dataTypeEquals<glu::TYPE_INT_VEC4>,		dataTypeEquals<glu::TYPE_INVALID>	}, "mediump float compare_ivec4    (mediump ivec4 a, mediump ivec4 b)  { return a == b ? 1.0 : 0.0; }"																					},
			{ { dataTypeEquals<glu::TYPE_UINT>,			dataTypeEquals<glu::TYPE_INVALID>	}, "mediump float compare_uint     (mediump uint a, mediump uint b)    { return a == b ? 1.0 : 0.0; }"																					},
			{ { dataTypeEquals<glu::TYPE_UINT_VEC2>,	dataTypeEquals<glu::TYPE_INVALID>	}, "mediump float compare_uvec2    (mediump uvec2 a, mediump uvec2 b)  { return a == b ? 1.0 : 0.0; }"																					},
			{ { dataTypeEquals<glu::TYPE_UINT_VEC3>,	dataTypeEquals<glu::TYPE_INVALID>	}, "mediump float compare_uvec3    (mediump uvec3 a, mediump uvec3 b)  { return a == b ? 1.0 : 0.0; }"																					},
			{ { dataTypeEquals<glu::TYPE_UINT_VEC4>,	dataTypeEquals<glu::TYPE_INVALID>	}, "mediump float compare_uvec4    (mediump uvec4 a, mediump uvec4 b)  { return a == b ? 1.0 : 0.0; }"																					},
			{ { dataTypeEquals<glu::TYPE_BOOL>,			dataTypeEquals<glu::TYPE_INVALID>	}, "mediump float compare_bool     (bool a, bool b)                    { return a == b ? 1.0 : 0.0; }"																					},
			{ { dataTypeEquals<glu::TYPE_BOOL_VEC2>,	dataTypeEquals<glu::TYPE_INVALID>	}, "mediump float compare_bvec2    (bvec2 a, bvec2 b)                  { return a == b ? 1.0 : 0.0; }"																					},
			{ { dataTypeEquals<glu::TYPE_BOOL_VEC3>,	dataTypeEquals<glu::TYPE_INVALID>	}, "mediump float compare_bvec3    (bvec3 a, bvec3 b)                  { return a == b ? 1.0 : 0.0; }"																					},
			{ { dataTypeEquals<glu::TYPE_BOOL_VEC4>,	dataTypeEquals<glu::TYPE_INVALID>	}, "mediump float compare_bvec4    (bvec4 a, bvec4 b)                  { return a == b ? 1.0 : 0.0; }"																					}
		};

		const vector<glu::DataType> samplerTypes = m_uniformCollection->getSamplerTypes();

		for (int compFuncNdx = 0; compFuncNdx < DE_LENGTH_OF_ARRAY(compareFuncs); compFuncNdx++)
		{
			const dataTypePredicate		(&typeReq)[2]			= compareFuncs[compFuncNdx].requiringTypes;
			bool						containsTypeSampler		= false;

			for (int i = 0; i < (int)samplerTypes.size(); i++)
			{
				if (glu::isDataTypeSampler(samplerTypes[i]))
				{
					const glu::DataType retType = getSamplerLookupReturnType(samplerTypes[i]);
					if (typeReq[0](retType) || typeReq[1](retType))
					{
						containsTypeSampler = true;
						break;
					}
				}
			}

			if (containsTypeSampler || m_uniformCollection->containsMatchingBasicType(typeReq[0]) || m_uniformCollection->containsMatchingBasicType(typeReq[1]))
				dst << compareFuncs[compFuncNdx].definition << "\n";
		}
	}
}